

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

arg_int * arg_intn(char *shortopts,char *longopts,char *datatype,int mincount,int maxcount,
                  char *glossary)

{
  arg_int *paVar1;
  char *local_50;
  int local_44;
  arg_int *result;
  size_t nbytes;
  char *glossary_local;
  int maxcount_local;
  int mincount_local;
  char *datatype_local;
  char *longopts_local;
  char *shortopts_local;
  
  local_44 = maxcount;
  if (maxcount < mincount) {
    local_44 = mincount;
  }
  paVar1 = (arg_int *)malloc((long)local_44 * 4 + 0x70);
  if (paVar1 != (arg_int *)0x0) {
    (paVar1->hdr).flag = '\x02';
    (paVar1->hdr).shortopts = shortopts;
    (paVar1->hdr).longopts = longopts;
    local_50 = datatype;
    if (datatype == (char *)0x0) {
      local_50 = "<int>";
    }
    (paVar1->hdr).datatype = local_50;
    (paVar1->hdr).glossary = glossary;
    (paVar1->hdr).mincount = mincount;
    (paVar1->hdr).maxcount = local_44;
    (paVar1->hdr).parent = paVar1;
    (paVar1->hdr).resetfn = arg_int_resetfn;
    (paVar1->hdr).scanfn = arg_int_scanfn;
    (paVar1->hdr).checkfn = arg_int_checkfn;
    (paVar1->hdr).errorfn = arg_int_errorfn;
    paVar1->ival = (int *)(paVar1 + 1);
    paVar1->count = 0;
  }
  return paVar1;
}

Assistant:

struct arg_int * arg_intn(
	const char * shortopts,
	const char * longopts,
	const char * datatype,
	int mincount,
	int maxcount,
	const char * glossary) {
	size_t nbytes;
	struct arg_int * result;

	/* foolproof things by ensuring maxcount is not less than mincount */
	maxcount = (maxcount < mincount) ? mincount : maxcount;

	nbytes = sizeof(struct arg_int)    /* storage for struct arg_int */
			 + maxcount * sizeof(int); /* storage for ival[maxcount] array */

	result = (struct arg_int *)malloc(nbytes);

	if (result) {
		/* init the arg_hdr struct */
		result->hdr.flag      = ARG_HASVALUE;
		result->hdr.shortopts = shortopts;
		result->hdr.longopts  = longopts;
		result->hdr.datatype  = datatype ? datatype : "<int>";
		result->hdr.glossary  = glossary;
		result->hdr.mincount  = mincount;
		result->hdr.maxcount  = maxcount;
		result->hdr.parent    = result;
		result->hdr.resetfn   = (arg_resetfn *)arg_int_resetfn;
		result->hdr.scanfn    = (arg_scanfn *)arg_int_scanfn;
		result->hdr.checkfn   = (arg_checkfn *)arg_int_checkfn;
		result->hdr.errorfn   = (arg_errorfn *)arg_int_errorfn;

		/* store the ival[maxcount] array immediately after the arg_int struct */
		result->ival  = (int *)(result + 1);
		result->count = 0;
	}

	ARG_TRACE(("arg_intn() returns %p\n", result));
	return result;
}